

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileOperation::
     Combine<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<float>>
               (ApproxQuantileState *source,ApproxQuantileState *target,AggregateInputData *param_3)

{
  TDigest *pTVar1;
  initializer_list<const_duckdb_tdigest::TDigest_*> __l;
  vector<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_> others;
  allocator_type local_41;
  TDigest *local_40;
  vector<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_> local_38
  ;
  
  if (source->pos != 0) {
    if (target->h == (TDigest *)0x0) {
      pTVar1 = (TDigest *)operator_new(0x80);
      duckdb_tdigest::TDigest::TDigest(pTVar1,100.0,0,0);
      target->h = pTVar1;
    }
    pTVar1 = target->h;
    local_40 = source->h;
    __l._M_len = 1;
    __l._M_array = &local_40;
    ::std::vector<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_>
    ::vector(&local_38,__l,&local_41);
    duckdb_tdigest::TDigest::add
              (pTVar1,(const_iterator)
                      local_38.
                      super__Vector_base<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
               (const_iterator)
               local_38.
               super__Vector_base<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (local_38.
        super__Vector_base<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (TDigest **)0x0) {
      operator_delete(local_38.
                      super__Vector_base<const_duckdb_tdigest::TDigest_*,_std::allocator<const_duckdb_tdigest::TDigest_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    target->pos = target->pos + source->pos;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.pos == 0) {
			return;
		}
		D_ASSERT(source.h);
		if (!target.h) {
			target.h = new duckdb_tdigest::TDigest(100);
		}
		target.h->merge(source.h);
		target.pos += source.pos;
	}